

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-keyconv-ossl.cpp
# Opt level: O2

int save_dsa_pkcs8(char *out_path,char *file_pin,key_material_t *pkey)

{
  int iVar1;
  DSA *key;
  BIGNUM *pBVar2;
  BIGNUM *pBVar3;
  BIGNUM *pBVar4;
  BIGNUM *pBVar5;
  BIGNUM *pBVar6;
  EVP_PKEY *pkey_00;
  PKCS8_PRIV_KEY_INFO *a;
  BIO *bp;
  size_t sVar7;
  X509_SIG *x;
  
  if ((((pkey[10].size == 0) || (pkey[0xd].size == 0)) || (pkey[0xe].size == 0)) ||
     ((pkey[0xb].size == 0 || (pkey[0xc].size == 0)))) {
    fwrite("ERROR: Some parts of the key material is missing in the input file.\n",0x44,1,_stderr);
  }
  else {
    key = DSA_new();
    pBVar2 = BN_bin2bn((uchar *)pkey[10].big,(int)pkey[10].size,(BIGNUM *)0x0);
    pBVar3 = BN_bin2bn((uchar *)pkey[0xd].big,(int)pkey[0xd].size,(BIGNUM *)0x0);
    pBVar4 = BN_bin2bn((uchar *)pkey[0xe].big,(int)pkey[0xe].size,(BIGNUM *)0x0);
    pBVar5 = BN_bin2bn((uchar *)pkey[0xb].big,(int)pkey[0xb].size,(BIGNUM *)0x0);
    pBVar6 = BN_bin2bn((uchar *)pkey[0xc].big,(int)pkey[0xc].size,(BIGNUM *)0x0);
    DSA_set0_pqg(key,pBVar2,pBVar3,pBVar4);
    DSA_set0_key(key,pBVar6,pBVar5);
    pkey_00 = EVP_PKEY_new();
    iVar1 = EVP_PKEY_set1_DSA(pkey_00,key);
    if (iVar1 == 0) {
      fwrite("ERROR: Could not convert DSA key to EVP_PKEY.\n",0x2e,1,_stderr);
      DSA_free(key);
    }
    else {
      DSA_free(key);
      a = EVP_PKEY2PKCS8(pkey_00);
      if (a != (PKCS8_PRIV_KEY_INFO *)0x0) {
        EVP_PKEY_free(pkey_00);
        bp = BIO_new_file(out_path,"wb");
        if (bp == (BIO *)0x0) {
          fwrite("ERROR: Could not open the output file.\n",0x27,1,_stderr);
          PKCS8_PRIV_KEY_INFO_free(a);
          return 1;
        }
        if (file_pin == (char *)0x0) {
          PEM_write_bio_PKCS8_PRIV_KEY_INFO(bp,a);
        }
        else {
          sVar7 = strlen(file_pin);
          x = PKCS8_encrypt(10,(EVP_CIPHER *)0x0,file_pin,(int)sVar7,(uchar *)0x0,0,0x800,a);
          if (x == (X509_SIG *)0x0) {
            fwrite("ERROR: Could not encrypt the PKCS#8 file\n",0x29,1,_stderr);
            iVar1 = 1;
            goto LAB_001032ad;
          }
          PEM_write_bio_PKCS8(bp,x);
          X509_SIG_free(x);
        }
        iVar1 = 0;
        printf("The key has been written to %s\n",out_path);
LAB_001032ad:
        PKCS8_PRIV_KEY_INFO_free(a);
        BIO_free_all(bp);
        return iVar1;
      }
      fwrite("ERROR: Could not convert EVP_PKEY to PKCS#8.\n",0x2d,1,_stderr);
    }
    EVP_PKEY_free(pkey_00);
  }
  return 1;
}

Assistant:

int save_dsa_pkcs8(char* out_path, char* file_pin, key_material_t* pkey)
{
	DSA* dsa = NULL;
	EVP_PKEY* ossl_pkey = NULL;
	PKCS8_PRIV_KEY_INFO* p8inf = NULL;
	BIO* out = NULL;
	X509_SIG* p8 = NULL;
	int result = 0;

	// See if the key material was found.
	if
	(
		pkey[TAG_PRIME].size <= 0 ||
		pkey[TAG_SUBPRIME].size <= 0 ||
		pkey[TAG_BASE].size <= 0 ||
		pkey[TAG_PRIVVAL].size <= 0 ||
		pkey[TAG_PUBVAL].size <= 0
	)
	{
		fprintf(stderr, "ERROR: Some parts of the key material is missing in the input file.\n");
		return 1;
	}

	dsa = DSA_new();
	BIGNUM* bn_p =        BN_bin2bn((unsigned char*)pkey[TAG_PRIME].big,    pkey[TAG_PRIME].size, NULL);
	BIGNUM* bn_q =        BN_bin2bn((unsigned char*)pkey[TAG_SUBPRIME].big, pkey[TAG_SUBPRIME].size, NULL);
	BIGNUM* bn_g =        BN_bin2bn((unsigned char*)pkey[TAG_BASE].big,     pkey[TAG_BASE].size, NULL);
	BIGNUM* bn_priv_key = BN_bin2bn((unsigned char*)pkey[TAG_PRIVVAL].big,  pkey[TAG_PRIVVAL].size, NULL);
	BIGNUM* bn_pub_key =  BN_bin2bn((unsigned char*)pkey[TAG_PUBVAL].big,   pkey[TAG_PUBVAL].size, NULL);

	DSA_set0_pqg(dsa, bn_p, bn_q, bn_g);
	DSA_set0_key(dsa, bn_pub_key, bn_priv_key);

	ossl_pkey = EVP_PKEY_new();

	// Convert DSA to EVP_PKEY
	if (!EVP_PKEY_set1_DSA(ossl_pkey, dsa))
	{
		fprintf(stderr, "ERROR: Could not convert DSA key to EVP_PKEY.\n");
		DSA_free(dsa);
		EVP_PKEY_free(ossl_pkey);
		return 1;
	}
	DSA_free(dsa);

	// Convert EVP_PKEY to PKCS#8
	if (!(p8inf = EVP_PKEY2PKCS8(ossl_pkey)))
	{
		fprintf(stderr, "ERROR: Could not convert EVP_PKEY to PKCS#8.\n");
		EVP_PKEY_free(ossl_pkey);
		return 1;
	}
	EVP_PKEY_free(ossl_pkey);

	// Open output file
	if (!(out = BIO_new_file (out_path, "wb")))
	{
		fprintf(stderr, "ERROR: Could not open the output file.\n");
		PKCS8_PRIV_KEY_INFO_free(p8inf);
		return 1;
	}

	// Write to disk
	if (file_pin == NULL)
	{
		PEM_write_bio_PKCS8_PRIV_KEY_INFO(out, p8inf);
		printf("The key has been written to %s\n", out_path);
	}
	else
	{
		// Encrypt p8
		if (!(p8 = PKCS8_encrypt(NID_pbeWithMD5AndDES_CBC, NULL,
					file_pin, strlen(file_pin), NULL, 
					0, PKCS12_DEFAULT_ITER, p8inf)))
		{
			fprintf(stderr, "ERROR: Could not encrypt the PKCS#8 file\n");
			result = 1;
		}
		else
		{
			PEM_write_bio_PKCS8(out, p8);
			X509_SIG_free(p8);
			printf("The key has been written to %s\n", out_path);
		}
	}

	PKCS8_PRIV_KEY_INFO_free(p8inf);
	BIO_free_all(out);

	return result;
}